

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_write_encrypt_aes256_file_fuzzer.c
# Opt level: O0

int LLVMFuzzerTestOneInput(uint8_t *data,size_t size)

{
  FILE *pFVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  int index;
  zip_source *source;
  zip *archive;
  char *pcStack_38;
  int error;
  char *file;
  char *password;
  char *path;
  size_t size_local;
  uint8_t *data_local;
  
  password = "test_aes256.zip";
  file = "password";
  pcStack_38 = "filename";
  archive._4_4_ = 0;
  path = (char *)size;
  size_local = (size_t)data;
  remove("test_aes256.zip");
  lVar3 = zip_open(password,1,(long)&archive + 4);
  if (lVar3 == 0) {
    data_local._4_4_ = -1;
  }
  else {
    lVar4 = zip_source_buffer(lVar3,size_local,path,0);
    pFVar1 = _stderr;
    if (lVar4 == 0) {
      uVar5 = zip_strerror(lVar3);
      fprintf(pFVar1,"failed to create source buffer. %s\n",uVar5);
      zip_discard(lVar3);
      data_local._4_4_ = -1;
    }
    else {
      iVar2 = zip_file_add(lVar3,pcStack_38,lVar4,0x2000);
      pFVar1 = _stderr;
      if (iVar2 < 0) {
        uVar5 = zip_strerror(lVar3);
        fprintf(pFVar1,"failed to add file to archive: %s\n",uVar5);
        zip_source_free(lVar4);
        zip_discard(lVar3);
        data_local._4_4_ = -1;
      }
      else {
        iVar2 = zip_file_set_encryption(lVar3,(long)iVar2,0x103,file);
        pFVar1 = _stderr;
        if (iVar2 < 0) {
          uVar5 = zip_strerror(lVar3);
          fprintf(pFVar1,"failed to set file encryption: %s\n",uVar5);
          zip_discard(lVar3);
          data_local._4_4_ = -1;
        }
        else {
          iVar2 = zip_close(lVar3);
          pFVar1 = _stderr;
          if (iVar2 < 0) {
            uVar5 = zip_strerror(lVar3);
            fprintf(pFVar1,"error closing archive: %s\n",uVar5);
            zip_discard(lVar3);
            data_local._4_4_ = -1;
          }
          else {
            remove(password);
            data_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

int
LLVMFuzzerTestOneInput(const uint8_t *data, size_t size) {
    const char *path = "test_aes256.zip";
    const char *password = "password";
    const char *file = "filename";
    int error = 0;
    struct zip *archive;

    (void)remove(path);
    if ((archive = zip_open(path, ZIP_CREATE, &error)) == NULL) {
        return -1;
    }

    struct zip_source *source = zip_source_buffer(archive, data, size, 0);
    if (source == NULL) {
        fprintf(stderr, "failed to create source buffer. %s\n", zip_strerror(archive));
        zip_discard(archive);
        return -1;
    }

    int index = (int)zip_file_add(archive, file, source, ZIP_FL_OVERWRITE);
    if (index < 0) {
        fprintf(stderr, "failed to add file to archive: %s\n", zip_strerror(archive));
        zip_source_free(source);
        zip_discard(archive);
        return -1;
    }
    if (zip_file_set_encryption(archive, index, ZIP_EM_AES_256, password) < 0) {
        fprintf(stderr, "failed to set file encryption: %s\n", zip_strerror(archive));
        zip_discard(archive);
        return -1;
    }
    if (zip_close(archive) < 0) {
        fprintf(stderr, "error closing archive: %s\n", zip_strerror(archive));
        zip_discard(archive);
        return -1;
    }
    (void)remove(path);

    return 0;
}